

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry_device.cpp
# Opt level: O0

void device_init(char *cfg)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float in_stack_fffffffffffff9ac;
  Vec3fa *in_stack_fffffffffffff9b0;
  RTCScene in_stack_fffffffffffff9b8;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined8 *local_558;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  undefined8 *local_540;
  undefined4 local_534;
  undefined4 local_530;
  undefined4 local_52c;
  undefined8 *local_528;
  undefined4 local_51c;
  undefined4 local_518;
  undefined4 local_514;
  undefined8 *local_510;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  embree::TutorialData_Constructor((TutorialData *)0x12a1bb);
  embree::g_scene = rtcNewScene(g_device);
  embree::data = embree::g_scene;
  rtcSetSceneBuildQuality(embree::g_scene,0);
  uVar3 = 1;
  rtcSetSceneFlags(embree::data);
  DAT_0060a400 = rtcNewScene(g_device);
  local_558 = &local_588;
  local_55c = 0;
  local_560 = 0;
  local_564 = 0x3f800000;
  local_4 = 0;
  local_8 = 0x3f800000;
  local_c = 0;
  local_10 = 0;
  local_28 = 0;
  uStack_20 = 0x3f800000;
  local_588 = 0;
  uStack_580 = 0x3f800000;
  embree::createTriangulatedSphere
            (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
  local_540 = &local_598;
  local_544 = 0x3f800000;
  local_548 = 0;
  local_54c = 0;
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0x3f800000;
  local_48 = 0x3f800000;
  uStack_40 = 0;
  local_598 = 0x3f800000;
  uStack_590 = 0;
  embree::createTriangulatedSphere
            (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
  local_528 = &local_5a8;
  local_52c = 0;
  local_530 = 0;
  local_534 = 0xbf800000;
  local_4c = 0;
  local_50 = 0xbf800000;
  local_54 = 0;
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0xbf800000;
  local_5a8 = 0;
  uStack_5a0 = 0xbf800000;
  embree::createTriangulatedSphere
            (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
  local_510 = &local_5b8;
  local_514 = 0xbf800000;
  local_518 = 0;
  local_51c = 0;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0xbf800000;
  local_88 = 0xbf800000;
  uStack_80 = 0;
  local_5b8 = 0xbf800000;
  uStack_5b0 = 0;
  embree::createTriangulatedSphere
            (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
  rtcCommitScene(DAT_0060a400);
  uVar2 = 0x79;
  embree::g_instance0 = rtcNewGeometry(g_device);
  rtcSetGeometryMask(embree::g_instance0,0x80);
  rtcSetGeometryInstancedScene(embree::g_instance0,DAT_0060a400);
  rtcSetGeometryTimeStepCount(embree::g_instance0,uVar3);
  embree::g_instance1 = rtcNewGeometry(g_device,uVar2);
  rtcSetGeometryInstancedScene(embree::g_instance1,DAT_0060a400);
  rtcSetGeometryTimeStepCount(embree::g_instance1,uVar3);
  embree::g_instance2 = rtcNewGeometry(g_device,uVar2);
  rtcSetGeometryInstancedScene(embree::g_instance2,DAT_0060a400);
  rtcSetGeometryTimeStepCount(embree::g_instance2,uVar3);
  embree::g_instance3 = rtcNewGeometry(g_device,uVar2);
  rtcSetGeometryInstancedScene(embree::g_instance3,DAT_0060a400);
  rtcSetGeometryTimeStepCount(embree::g_instance3,uVar3);
  rtcAttachGeometry(embree::data,embree::g_instance0);
  rtcAttachGeometry(embree::data,embree::g_instance1);
  rtcAttachGeometry(embree::data,embree::g_instance2);
  rtcAttachGeometry(embree::data,embree::g_instance3);
  rtcReleaseGeometry(embree::g_instance0);
  rtcReleaseGeometry(embree::g_instance1);
  rtcReleaseGeometry(embree::g_instance2);
  rtcReleaseGeometry(embree::g_instance3);
  embree::createGroundPlane((RTCScene)CONCAT44(uVar3,uVar2));
  puVar1 = DAT_0060a420;
  *DAT_0060a420 = 0x3e800000;
  puVar1[1] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[2] = 0x3f000000;
  puVar1[3] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[4] = 0x3f400000;
  puVar1[5] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[6] = 0x3f800000;
  puVar1[7] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[8] = 0x3e80000000000000;
  puVar1[9] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[10] = 0x3f00000000000000;
  puVar1[0xb] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0xc] = 0x3f40000000000000;
  puVar1[0xd] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0xe] = 0x3f80000000000000;
  puVar1[0xf] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0x10] = 0;
  puVar1[0x11] = 0x3e800000;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0x12] = 0;
  puVar1[0x13] = 0x3f000000;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0x14] = 0;
  puVar1[0x15] = 0x3f400000;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0x16] = 0;
  puVar1[0x17] = 0x3f800000;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0x18] = 0x3e8000003e800000;
  puVar1[0x19] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0x1a] = 0x3f0000003f000000;
  puVar1[0x1b] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0x1c] = 0x3f4000003f400000;
  puVar1[0x1d] = 0;
  puVar1 = DAT_0060a420;
  DAT_0060a420[0x1e] = 0x3f8000003f800000;
  puVar1[0x1f] = 0;
  return;
}

Assistant:

void device_init (char* cfg)
{
  TutorialData_Constructor(&data);
  
  /* create scene */
  data.g_scene = g_scene = rtcNewScene(g_device);
  rtcSetSceneBuildQuality(data.g_scene,RTC_BUILD_QUALITY_LOW);
  rtcSetSceneFlags(data.g_scene,RTC_SCENE_FLAG_DYNAMIC);

  /* create scene with 4 triangulated spheres */
  data.g_scene1 = rtcNewScene(g_device);
  createTriangulatedSphere(data.g_scene1,Vec3fa( 0, 0,+1),0.5f);
  createTriangulatedSphere(data.g_scene1,Vec3fa(+1, 0, 0),0.5f);
  createTriangulatedSphere(data.g_scene1,Vec3fa( 0, 0,-1),0.5f);
  createTriangulatedSphere(data.g_scene1,Vec3fa(-1, 0, 0),0.5f);
  rtcCommitScene (data.g_scene1);

  /* instantiate geometry */
  g_instance0 = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryMask(g_instance0, 0x80); // test high instance mask bits
  rtcSetGeometryInstancedScene(g_instance0,data.g_scene1);
  rtcSetGeometryTimeStepCount(g_instance0,1);
  g_instance1 = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance1,data.g_scene1);
  rtcSetGeometryTimeStepCount(g_instance1,1);
  g_instance2 = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance2,data.g_scene1);
  rtcSetGeometryTimeStepCount(g_instance2,1);
  g_instance3 = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance3,data.g_scene1);
  rtcSetGeometryTimeStepCount(g_instance3,1);
  rtcAttachGeometry(data.g_scene,g_instance0);
  rtcAttachGeometry(data.g_scene,g_instance1);
  rtcAttachGeometry(data.g_scene,g_instance2);
  rtcAttachGeometry(data.g_scene,g_instance3);
  rtcReleaseGeometry(g_instance0);
  rtcReleaseGeometry(g_instance1);
  rtcReleaseGeometry(g_instance2);
  rtcReleaseGeometry(g_instance3);
  createGroundPlane(data.g_scene);

  /* set all colors */
  data.colors[4*0+0] = Vec3fa(0.25f, 0.f, 0.f);
  data.colors[4*0+1] = Vec3fa(0.50f, 0.f, 0.f);
  data.colors[4*0+2] = Vec3fa(0.75f, 0.f, 0.f);
  data.colors[4*0+3] = Vec3fa(1.00f, 0.f, 0.f);

  data.colors[4*1+0] = Vec3fa(0.f, 0.25f, 0.f);
  data.colors[4*1+1] = Vec3fa(0.f, 0.50f, 0.f);
  data.colors[4*1+2] = Vec3fa(0.f, 0.75f, 0.f);
  data.colors[4*1+3] = Vec3fa(0.f, 1.00f, 0.f);

  data.colors[4*2+0] = Vec3fa(0.f, 0.f, 0.25f);
  data.colors[4*2+1] = Vec3fa(0.f, 0.f, 0.50f);
  data.colors[4*2+2] = Vec3fa(0.f, 0.f, 0.75f);
  data.colors[4*2+3] = Vec3fa(0.f, 0.f, 1.00f);

  data.colors[4*3+0] = Vec3fa(0.25f, 0.25f, 0.f);
  data.colors[4*3+1] = Vec3fa(0.50f, 0.50f, 0.f);
  data.colors[4*3+2] = Vec3fa(0.75f, 0.75f, 0.f);
  data.colors[4*3+3] = Vec3fa(1.00f, 1.00f, 0.f);
}